

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.cpp
# Opt level: O1

int main(void)

{
  _List_node_base *p_Var1;
  pointer pPVar2;
  _List_node_base *p_Var3;
  ostream *poVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  SpanBytesConst deserialize_ptr;
  Image image_out;
  SpanBytes serialize_ptr;
  anon_class_8_1_4eff857e func_2;
  Serializer<Image> local_1d9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1d8;
  SpanBytesConst local_1b8;
  Image local_1a8;
  SpanBytes local_f8;
  Image local_e8;
  anon_class_8_1_4eff857e local_38;
  
  local_e8.name._M_dataplus._M_p = (pointer)&local_e8.name.field_2;
  local_e8.name._M_string_length = 0;
  local_e8.name.field_2._M_local_buf[0] = '\0';
  local_e8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_e8.quats;
  local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node._M_size =
       0;
  local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (Point3D *)0x0;
  local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Point3D *)0x0;
  local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
       super__List_node_base._M_next;
  std::__cxx11::string::_M_replace((ulong)&local_e8.name,0,(char *)0x0,0x104004);
  local_e8.width = 0x280;
  local_e8.height = 0x1e0;
  local_1a8._0_8_ = local_1a8._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_e8.data,0x4b000,(value_type_conflict *)&local_1a8);
  local_e8.pose.pos.x = 1.0;
  local_e8.pose.pos.y = 2.0;
  local_e8.pose.pos.z = 3.0;
  local_e8.pose.rot.x = 0.1;
  local_e8.pose.rot.y = 0.2;
  local_e8.pose.rot.z = 0.3;
  local_e8.pose.rot.w = 0.4;
  local_e8.array._M_elems[0] = 0x2a;
  local_e8.array._M_elems[1] = 0x45;
  iVar8 = 0;
  do {
    local_1a8._0_8_ = (BADTYPE)iVar8;
    local_1a8.name._M_dataplus._M_p = (pointer)(double)(iVar8 + 1);
    local_1a8.name._M_string_length = (size_type)(double)(iVar8 + 2);
    if (local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Point3D,_std::allocator<Point3D>_>::_M_realloc_insert<Point3D>
                (&local_e8.points,
                 (iterator)
                 local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
                 super__Vector_impl_data._M_finish,(Point3D *)&local_1a8);
    }
    else {
      (local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
       super__Vector_impl_data._M_finish)->z = (double)local_1a8.name._M_string_length;
      (local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
       super__Vector_impl_data._M_finish)->x = (double)local_1a8._0_8_;
      (local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
       super__Vector_impl_data._M_finish)->y = (double)local_1a8.name._M_dataplus._M_p;
      local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    p_Var3 = (_List_node_base *)operator_new(0x30);
    p_Var3[1]._M_next = (_List_node_base *)0x3fb999999999999a;
    p_Var3[1]._M_prev = (_List_node_base *)0xbfc999999999999a;
    p_Var3[2]._M_next = (_List_node_base *)0x3fd3333333333333;
    p_Var3[2]._M_prev = (_List_node_base *)0xbfd999999999999a;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node._M_size
         = local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
           _M_size + 1;
    iVar8 = iVar8 + 1;
  } while (iVar8 != 4);
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._0_8_ = (SpanBytes *)0x0;
  local_f8.data_ = (uchar *)&local_1a8;
  SerializeMe::Serializer<Image>::operator()
            ((Serializer<Image> *)&local_1b8,&local_e8,(anon_class_8_1_736c71da *)&local_f8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&local_1d8,local_1a8._0_8_);
  local_f8.data_ =
       local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_f8.size_ =
       (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1a8._0_8_ = &local_f8;
  SerializeMe::Serializer<Image>::operator()
            ((Serializer<Image> *)&local_1b8,&local_e8,(anon_class_8_1_4eff857e *)&local_1a8);
  local_1a8.name._M_dataplus._M_p = (pointer)&local_1a8.name.field_2;
  local_1a8.name._M_string_length = 0;
  local_1a8.name.field_2._M_local_buf[0] = '\0';
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&local_1a8.quats;
  local_1a8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node._M_size
       = 0;
  local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8.size_ =
       (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1b8.data_ =
       local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1a8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       local_1a8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
       super__List_node_base._M_next;
  local_38.buffer = &local_1b8;
  SerializeMe::Serializer<Image>::operator()(&local_1d9,&local_1a8,&local_38);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image name: ",0xc);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,local_1a8.name._M_dataplus._M_p,
                      local_1a8.name._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image width: ",0xd);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1a8.width);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Image height: ",0xe);
  plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_1a8.height);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pixels count: ",0xe);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pose/pos: ",10);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.pos.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.pos.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.pos.z);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Pose/rot: ",10);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.rot.x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.rot.y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.rot.z);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
  poVar4 = std::ostream::_M_insert<double>(local_1a8.pose.rot.w);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0x10;
    uVar9 = 0;
    do {
      pPVar2 = local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Point[",6);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar9);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]: ",3);
      poVar4 = std::ostream::_M_insert<double>(*(double *)((long)pPVar2 + lVar7 + -0x10));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>(*(double *)((long)pPVar2 + lVar7 + -8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
      poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&pPVar2->x + lVar7));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      uVar9 = uVar9 + 1;
      uVar6 = ((long)local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar7 = lVar7 + 0x18;
    } while (uVar9 <= uVar6 && uVar6 - uVar9 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Buffer size: ",0xd);
  poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  if (local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  p_Var3 = local_1a8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node
           .super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&local_1a8.quats) {
    p_Var1 = p_Var3->_M_next;
    operator_delete(p_Var3,0x30);
    p_Var3 = p_Var1;
  }
  if (local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_1a8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1a8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8.name._M_dataplus._M_p != &local_1a8.name.field_2) {
    operator_delete(local_1a8.name._M_dataplus._M_p,
                    CONCAT71(local_1a8.name.field_2._M_allocated_capacity._1_7_,
                             local_1a8.name.field_2._M_local_buf[0]) + 1);
  }
  if (local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_1d8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1d8.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  p_Var3 = local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl._M_node.
           super__List_node_base._M_next;
  if (local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.points.super__Vector_base<Point3D,_std::allocator<Point3D>_>.
                          _M_impl.super__Vector_impl_data._M_start);
    p_Var3 = local_e8.quats.super__List_base<Quaternion,_std::allocator<Quaternion>_>._M_impl.
             _M_node.super__List_node_base._M_next;
  }
  while (p_Var3 != (_List_node_base *)&local_e8.quats) {
    p_Var1 = (((_List_base<Quaternion,_std::allocator<Quaternion>_> *)&p_Var3->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var3,0x30);
    p_Var3 = p_Var1;
  }
  if (local_e8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8.name._M_dataplus._M_p != &local_e8.name.field_2) {
    operator_delete(local_e8.name._M_dataplus._M_p,
                    CONCAT71(local_e8.name.field_2._M_allocated_capacity._1_7_,
                             local_e8.name.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main()
{
  Image image;

  image.name = "pepito";
  image.width = 640;
  image.height = 480;
  image.data.resize(image.width * image.height, 0);
  image.pose.pos = {1, 2, 3};
  image.pose.rot = {0.1, 0.2, 0.3, 0.4};
  image.array = {42, 69};
  for (int i = 0; i < 4; i++)
  {
    image.points.push_back(Point3D{double(i), double(i + 1), double(i + 2)});
    image.quats.push_back({0.1, -0.2, 0.3, -0.4});
  }

  //--- This is the serialized buffer. Allocate memory manually -----
  std::vector<uint8_t> buffer;
  size_t size = SerializeMe::BufferSize(image);
  buffer.resize(size);

  //------ Serialize into the buffer -----
  SerializeMe::SpanBytes serialize_ptr(buffer);
  SerializeMe::SerializeIntoBuffer(serialize_ptr, image);

  //------ Deserialize from buffer to image -----
  Image image_out;
  SerializeMe::SpanBytesConst deserialize_ptr(buffer.data(), buffer.size());
  SerializeMe::DeserializeFromBuffer(deserialize_ptr, image_out);

  //------ Check results -------
  std::cout << "Image name: " << image_out.name << std::endl;
  std::cout << "Image width: " << image_out.width << std::endl;
  std::cout << "Image height: " << image_out.height << std::endl;
  std::cout << "Pixels count: " << image_out.data.size() << std::endl;

  std::cout << "Pose/pos: " << image_out.pose.pos.x << ", " << image_out.pose.pos.y
            << ", " << image_out.pose.pos.z << std::endl;

  std::cout << "Pose/rot: " << image_out.pose.rot.x << ", " << image_out.pose.rot.y
            << ", " << image_out.pose.rot.z << ", " << image_out.pose.rot.w << std::endl;

  for (int i = 0; i < image_out.points.size(); i++)
  {
    const auto& p = image_out.points[i];
    std::cout << "Point[" << i << "]: " << p.x << ", " << p.y << ", " << p.z << std::endl;
  }

  std::cout << "Buffer size: " << buffer.size() << std::endl;

  return 0;
}